

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall wallet::CWallet::UpgradeDescriptorCache(CWallet *this)

{
  bool bVar1;
  DescriptorScriptPubKeyMan *this_00;
  long in_FS_OFFSET;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) != 0) &&
      (bVar1 = IsLocked(this), !bVar1)) &&
     (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 4) == 0)) {
    GetAllScriptPubKeyMans
              ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                *)&local_60,this);
    for (; (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
           &local_60._M_impl.super__Rb_tree_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::_Rb_tree_increment
                       ((_Rb_tree_node_base *)
                        local_60._M_impl.super__Rb_tree_header._M_header._M_left)) {
      this_00 = (DescriptorScriptPubKeyMan *)
                __dynamic_cast(*(undefined8 *)
                                (local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1),
                               &ScriptPubKeyMan::typeinfo,&DescriptorScriptPubKeyMan::typeinfo,0);
      DescriptorScriptPubKeyMan::UpgradeDescriptorCache(this_00);
    }
    std::
    _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
    ::~_Rb_tree(&local_60);
    SetWalletFlag(this,4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::UpgradeDescriptorCache()
{
    if (!IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS) || IsLocked() || IsWalletFlagSet(WALLET_FLAG_LAST_HARDENED_XPUB_CACHED)) {
        return;
    }

    for (ScriptPubKeyMan* spkm : GetAllScriptPubKeyMans()) {
        DescriptorScriptPubKeyMan* desc_spkm = dynamic_cast<DescriptorScriptPubKeyMan*>(spkm);
        desc_spkm->UpgradeDescriptorCache();
    }
    SetWalletFlag(WALLET_FLAG_LAST_HARDENED_XPUB_CACHED);
}